

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NinjaBuildCommand.cpp
# Opt level: O3

void __thiscall
(anonymous_namespace)::buildInput((anonymous_namespace)::BuildContext&,llbuild::ninja::Node*)::
NinjaInputTask::inputsAvailable(llbuild::core::TaskInterface_(void *this,TaskInterface ti)

{
  long lVar1;
  FileInfo *pFVar2;
  anon_union_80_2_ecfed234_for_valueData *paVar3;
  byte bVar4;
  FileInfo outputInfo;
  TaskInterface local_e0;
  ValueType local_d0;
  FileInfo local_b8;
  BuildValue local_68;
  
  local_e0.ctx = ti.ctx;
  local_e0.impl = ti.impl;
  bVar4 = 0;
  if (*(char *)(*(long *)((long)this + 8) + 0x91) == '\x01') {
    local_68.valueData._68_4_ = 0;
    local_68.valueData._72_4_ = 0;
    local_68.valueData._76_4_ = 0;
    local_68.valueData._52_5_ = 0;
    local_68.valueData._57_3_ = 0;
    local_68.valueData._60_4_ = 0;
    local_68.valueData._64_4_ = 0;
    local_68.kind = ExistingInput;
    local_68.numOutputInfos = 1;
    local_68.commandHash.value = 0;
    local_68.valueData.asOutputInfo.device._0_4_ = 0;
    local_68.valueData.asOutputInfo.device._4_4_ = 0;
    local_68.valueData.asOutputInfo.inode._0_4_ = 0;
    local_68.valueData.asOutputInfo.inode._4_4_ = 0;
    local_68.valueData.asOutputInfo.mode._0_4_ = 0;
    local_68.valueData.asOutputInfo.mode._4_4_ = 0;
    local_68.valueData.asOutputInfo.size._0_4_ = 0;
    local_68.valueData.asOutputInfo.size._4_4_ = 0;
    local_68.valueData.asOutputInfo.modTime.seconds._0_4_ = 0;
    local_68.valueData.asOutputInfo.modTime.seconds._4_4_ = 0;
    local_68.valueData.asOutputInfo.modTime.nanoseconds._0_4_ = 0;
    local_68.valueData.asOutputInfo.modTime.nanoseconds._4_4_ = 0;
    local_68.valueData._48_4_ = 0;
    anon_unknown.dwarf_b0fca::BuildValue::toValue((ValueType *)&local_b8,&local_68);
    llbuild::core::TaskInterface::complete(&local_e0,(ValueType *)&local_b8,false);
    local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_b8.device;
    local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_b8.mode;
  }
  else {
    llbuild::basic::FileInfo::getInfoForPath(&local_b8,*(string **)((long)this + 0x10),false);
    if (((((pointer)local_b8.device == (pointer)0x0) && (local_b8.inode == 0)) &&
        ((pointer)local_b8.mode == (pointer)0x0)) &&
       (((local_b8.size == 0 && (local_b8.modTime.seconds == 0)) &&
        (local_b8.modTime.nanoseconds == 0)))) {
      local_68.kind = MissingInput;
      local_68.numOutputInfos = 0;
      local_68.valueData.asOutputInfo.device._0_4_ = 0;
      local_68.valueData.asOutputInfo.device._4_4_ = 0;
      local_68.valueData.asOutputInfo.inode._0_4_ = 0;
      local_68.valueData.asOutputInfo.inode._4_4_ = 0;
      local_68.valueData.asOutputInfo.mode._0_4_ = 0;
      local_68.valueData.asOutputInfo.mode._4_4_ = 0;
      local_68.valueData.asOutputInfo.size._0_4_ = 0;
      local_68.valueData.asOutputInfo.size._4_4_ = 0;
      local_68.valueData.asOutputInfo.modTime.seconds._0_4_ = 0;
      local_68.valueData.asOutputInfo.modTime.seconds._4_4_ = 0;
      local_68.valueData.asOutputInfo.modTime.nanoseconds._0_4_ = 0;
      local_68.valueData.asOutputInfo.modTime.nanoseconds._4_4_ = 0;
      local_68.valueData._48_4_ = 0;
      local_68.valueData._52_5_ = 0;
      local_68.valueData._57_3_ = 0;
      local_68.valueData._60_4_ = 0;
      local_68.valueData._64_4_ = 0;
      local_68.valueData._68_4_ = 0;
      local_68.valueData._72_4_ = 0;
      local_68.valueData._76_4_ = 0;
      local_68.commandHash.value = 0;
    }
    else {
      local_68.kind = ExistingInput;
      local_68.numOutputInfos = 1;
      local_68.commandHash.value = 0;
      pFVar2 = &local_b8;
      paVar3 = &local_68.valueData;
      for (lVar1 = 10; lVar1 != 0; lVar1 = lVar1 + -1) {
        (paVar3->asOutputInfo).device = pFVar2->device;
        pFVar2 = (FileInfo *)((long)pFVar2 + ((ulong)bVar4 * -2 + 1) * 8);
        paVar3 = (anon_union_80_2_ecfed234_for_valueData *)
                 (&paVar3->asOutputInfos + (ulong)bVar4 * -2 + 1);
      }
    }
    anon_unknown.dwarf_b0fca::BuildValue::toValue(&local_d0,&local_68);
    llbuild::core::TaskInterface::complete(&local_e0,&local_d0,false);
  }
  if (local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

virtual void inputsAvailable(core::TaskInterface ti) override {
      if (context.simulate) {
        ti.complete(BuildValue::makeExistingInput({}).toValue());
        return;
      }

      auto outputInfo = FileInfo::getInfoForPath(node->getCanonicalPath());
      if (outputInfo.isMissing()) {
        ti.complete(BuildValue::makeMissingInput().toValue());
        return;
      }

      ti.complete(BuildValue::makeExistingInput(outputInfo).toValue());
    }